

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_non_terminals.hpp
# Opt level: O0

error_code __thiscall
pstore::exchange::import_ns::
array_rule<pstore::exchange::import_ns::definition_object,_std::vector<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>_*,_pstore::gsl::not_null<const_pstore::exchange::import_ns::string_mapping_*>,_std::shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>_>
::begin_array(array_rule<pstore::exchange::import_ns::definition_object,_std::vector<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>_*,_pstore::gsl::not_null<const_pstore::exchange::import_ns::string_mapping_*>,_std::shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>_>
              *this)

{
  error_code eVar1;
  tuple<pstore::exchange::import_ns::array_rule<pstore::exchange::import_ns::definition_object,_std::vector<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>_*,_pstore::gsl::not_null<const_pstore::exchange::import_ns::string_mapping_*>,_std::shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>_>_*>
  local_60;
  __type local_58;
  code *local_30;
  undefined8 local_28;
  array_rule<pstore::exchange::import_ns::definition_object,_std::vector<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>_*,_pstore::gsl::not_null<const_pstore::exchange::import_ns::string_mapping_*>,_std::shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>_>
  *local_20;
  array_rule<pstore::exchange::import_ns::definition_object,_std::vector<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>_*,_pstore::gsl::not_null<const_pstore::exchange::import_ns::string_mapping_*>,_std::shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>_>
  *this_local;
  error_category *local_10;
  
  local_30 = rule::
             replace_top<pstore::exchange::import_ns::definition_object,std::vector<pstore::repo::definition,std::allocator<pstore::repo::definition>>*,pstore::gsl::not_null<pstore::exchange::import_ns::string_mapping_const*>,std::shared_ptr<pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::fragment>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>>
  ;
  local_28 = 0;
  local_20 = this;
  std::
  make_tuple<pstore::exchange::import_ns::array_rule<pstore::exchange::import_ns::definition_object,std::vector<pstore::repo::definition,std::allocator<pstore::repo::definition>>*,pstore::gsl::not_null<pstore::exchange::import_ns::string_mapping_const*>,std::shared_ptr<pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::fragment>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>>*>
            ((array_rule<pstore::exchange::import_ns::definition_object,_std::vector<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>_*,_pstore::gsl::not_null<const_pstore::exchange::import_ns::string_mapping_*>,_std::shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>_>
              **)&local_60);
  std::
  tuple_cat<std::tuple<pstore::exchange::import_ns::array_rule<pstore::exchange::import_ns::definition_object,std::vector<pstore::repo::definition,std::allocator<pstore::repo::definition>>*,pstore::gsl::not_null<pstore::exchange::import_ns::string_mapping_const*>,std::shared_ptr<pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::fragment>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>>*>,std::tuple<std::vector<pstore::repo::definition,std::allocator<pstore::repo::definition>>*,pstore::gsl::not_null<pstore::exchange::import_ns::string_mapping_const*>,std::shared_ptr<pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::fragment>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>>&,void>
            (&local_58,&local_60,&this->args_);
  cxx17shim::
  apply<std::error_code(pstore::exchange::import_ns::rule::*)(std::vector<pstore::repo::definition,std::allocator<pstore::repo::definition>>*,pstore::gsl::not_null<pstore::exchange::import_ns::string_mapping_const*>,std::shared_ptr<pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::fragment>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>),std::tuple<pstore::exchange::import_ns::array_rule<pstore::exchange::import_ns::definition_object,std::vector<pstore::repo::definition,std::allocator<pstore::repo::definition>>*,pstore::gsl::not_null<pstore::exchange::import_ns::string_mapping_const*>,std::shared_ptr<pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::fragment>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>>*,std::vector<pstore::repo::definition,std::allocator<pstore::repo::definition>>*,pstore::gsl::not_null<pstore::exchange::import_ns::string_mapping_const*>,std::shared_ptr<pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::fragment>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>>>
            ((offset_in_rule_to_subr *)&local_30,&local_58);
  std::
  tuple<pstore::exchange::import_ns::array_rule<pstore::exchange::import_ns::definition_object,_std::vector<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>_*,_pstore::gsl::not_null<const_pstore::exchange::import_ns::string_mapping_*>,_std::shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>_>_*,_std::vector<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>_*,_pstore::gsl::not_null<const_pstore::exchange::import_ns::string_mapping_*>,_std::shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>_>
  ::~tuple(&local_58);
  std::error_code::error_code((error_code *)&this_local);
  eVar1._4_4_ = 0;
  eVar1._M_value = (uint)this_local;
  eVar1._M_cat = local_10;
  return eVar1;
}

Assistant:

std::error_code begin_array () override {
                    cxx17shim::apply (&array_rule::replace_top<NextRule, Args...>,
                                      std::tuple_cat (std::make_tuple (this), args_));
                    return {};
                }